

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt_pal.cpp
# Opt level: O0

void __thiscall
swrenderer::DrawColumnRt4TranslatedPalCommand::Execute
          (DrawColumnRt4TranslatedPalCommand *this,DrawerThread *thread)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  uint uVar3;
  int iVar4;
  int local_40;
  int count8;
  uint8_t b1;
  uint8_t b0;
  int c1;
  int c0;
  uint8_t *translation;
  uint8_t *source;
  int count;
  DrawerThread *thread_local;
  DrawColumnRt4TranslatedPalCommand *this_local;
  
  uVar3 = DrawerThread::count_for_thread
                    (thread,(this->super_PalRtCommand).yl,
                     ((this->super_PalRtCommand).yh - (this->super_PalRtCommand).yl) + 1);
  if (0 < (int)uVar3) {
    puVar2 = thread->dc_temp;
    iVar4 = DrawerThread::temp_line_for_thread(thread,(this->super_PalRtCommand).yl);
    translation = puVar2 + (iVar4 << 2);
    puVar2 = (this->super_PalRtCommand)._translation;
    for (local_40 = (int)uVar3 >> 1; local_40 != 0; local_40 = local_40 + -1) {
      uVar1 = puVar2[(int)(uint)translation[1]];
      *translation = puVar2[(int)(uint)*translation];
      translation[1] = uVar1;
      uVar1 = puVar2[(int)(uint)translation[3]];
      translation[2] = puVar2[(int)(uint)translation[2]];
      translation[3] = uVar1;
      uVar1 = puVar2[(int)(uint)translation[5]];
      translation[4] = puVar2[(int)(uint)translation[4]];
      translation[5] = uVar1;
      uVar1 = puVar2[(int)(uint)translation[7]];
      translation[6] = puVar2[(int)(uint)translation[6]];
      translation[7] = uVar1;
      translation = translation + 8;
    }
    if ((uVar3 & 1) != 0) {
      uVar1 = puVar2[(int)(uint)translation[1]];
      *translation = puVar2[(int)(uint)*translation];
      translation[1] = uVar1;
      uVar1 = puVar2[(int)(uint)translation[3]];
      translation[2] = puVar2[(int)(uint)translation[2]];
      translation[3] = uVar1;
    }
  }
  return;
}

Assistant:

void DrawColumnRt4TranslatedPalCommand::Execute(DrawerThread *thread)
	{
		int count = yh - yl + 1;
		count = thread->count_for_thread(yl, count);
		if (count <= 0)
			return;

		uint8_t *source = &thread->dc_temp[thread->temp_line_for_thread(yl)*4];
		const uint8_t *translation = _translation;
		int c0, c1;
		uint8_t b0, b1;

		// Do 2 rows at a time.
		for (int count8 = count >> 1; count8; --count8)
		{
			c0 = source[0];			c1 = source[1];
			b0 = translation[c0];	b1 = translation[c1];
			source[0] = b0;			source[1] = b1;

			c0 = source[2];			c1 = source[3];
			b0 = translation[c0];	b1 = translation[c1];
			source[2] = b0;			source[3] = b1;

			c0 = source[4];			c1 = source[5];
			b0 = translation[c0];	b1 = translation[c1];
			source[4] = b0;			source[5] = b1;

			c0 = source[6];			c1 = source[7];
			b0 = translation[c0];	b1 = translation[c1];
			source[6] = b0;			source[7] = b1;

			source += 8;
		}
		// Do the final row if count was odd.
		if (count & 1)
		{
			c0 = source[0];			c1 = source[1];
			b0 = translation[c0];	b1 = translation[c1];
			source[0] = b0;			source[1] = b1;

			c0 = source[2];			c1 = source[3];
			b0 = translation[c0];	b1 = translation[c1];
			source[2] = b0;			source[3] = b1;
		}
	}